

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SegReaderCursor(Fts3Table *p,int iLangid,int iIndex,int iLevel,char *zTerm,int nTerm,
                       int isPrefix,int isScan,Fts3MultiSegReader *pCsr)

{
  sqlite3_uint64 n;
  Fts3Hash *pH;
  bool bVar1;
  int iVar2;
  int iVar3;
  Fts3SegReader **ppFVar4;
  sqlite3_int64 iEndBlock;
  char *zNode;
  Fts3SegReader *pFVar5;
  ulong iValue;
  sqlite3_int64 *piLeaf2;
  uint uVar6;
  size_t __nmemb;
  long lVar7;
  long in_FS_OFFSET;
  Fts3SegReader **local_80;
  uint local_70;
  sqlite3_int64 iLeavesEndBlock;
  sqlite3_int64 iStartBlock;
  Fts3SegReader *pSeg;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar7 = (long)iIndex;
  if (iLevel < 0) {
    iVar2 = 0;
    if ((p->aIndex != (Fts3Index *)0x0) && (p->iPrevLangid == iLangid)) {
      pSeg = (Fts3SegReader *)&DAT_aaaaaaaaaaaaaaaa;
      pH = &p->aIndex[lVar7].hPending;
      iVar2 = 7;
      if (isScan == 0 && isPrefix == 0) {
        pSeg = (Fts3SegReader *)sqlite3Fts3HashFindElem(pH,zTerm,nTerm);
        if (pSeg != (Fts3SegReader *)0x0) {
          uVar6 = 1;
          local_80 = &pSeg;
          goto LAB_001aa275;
        }
        iVar2 = 0;
      }
      else {
        local_70 = 0;
        local_80 = (Fts3SegReader **)0x0;
        pFVar5 = (Fts3SegReader *)&pH->first;
        __nmemb = 0;
        while( true ) {
          pFVar5 = *(Fts3SegReader **)pFVar5;
          uVar6 = (uint)__nmemb;
          pSeg = pFVar5;
          if (pFVar5 == (Fts3SegReader *)0x0) break;
          if ((nTerm == 0) ||
             ((nTerm <= (int)pFVar5->iCurrentBlock &&
              (iVar3 = bcmp((void *)pFVar5->iEndBlock,zTerm,(long)nTerm), iVar3 == 0)))) {
            if (uVar6 == local_70) {
              ppFVar4 = (Fts3SegReader **)sqlite3_realloc64(local_80,__nmemb * 8 + 0x80);
              if (ppFVar4 == (Fts3SegReader **)0x0) {
                bVar1 = false;
                goto LAB_001aa2d2;
              }
              local_70 = uVar6 + 0x10;
              local_80 = ppFVar4;
            }
            local_80[__nmemb] = pFVar5;
            pFVar5 = pSeg;
            __nmemb = (ulong)(uVar6 + 1);
          }
        }
        if (uVar6 < 2) {
          if (uVar6 == 1) {
            uVar6 = 1;
            goto LAB_001aa275;
          }
          iVar2 = 0;
          bVar1 = true;
LAB_001aa2d2:
          pFVar5 = (Fts3SegReader *)0x0;
        }
        else {
          qsort(local_80,__nmemb,8,fts3CompareElemByTerm);
LAB_001aa275:
          n = (ulong)uVar6 * 8 + 0x90;
          pFVar5 = (Fts3SegReader *)sqlite3_malloc64(n);
          bVar1 = false;
          if (pFVar5 == (Fts3SegReader *)0x0) goto LAB_001aa2d2;
          memset(pFVar5,0,n);
          pFVar5->iIdx = 0x7fffffff;
          pFVar5->ppNextElem = (Fts3HashElem **)(pFVar5 + 1);
          memcpy(pFVar5 + 1,local_80,(ulong)uVar6 << 3);
          bVar1 = true;
          iVar2 = 0;
        }
        if (isScan != 0 || isPrefix != 0) {
          sqlite3_free(local_80);
        }
        if (bVar1 && pFVar5 != (Fts3SegReader *)0x0) {
          iVar2 = fts3SegReaderCursorAppend(pCsr,pFVar5);
        }
      }
    }
    if (iLevel == -1) {
      pFVar5 = (Fts3SegReader *)0x0;
LAB_001aa1e3:
      iVar3 = sqlite3_reset((sqlite3_stmt *)pFVar5);
      if (iVar2 != 0x65) {
        iVar3 = iVar2;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return iVar3;
    }
    if (iVar2 != 0) {
      pFVar5 = (Fts3SegReader *)0x0;
      goto LAB_001aa0b8;
    }
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(p,0xd,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar5 = pSeg;
    if (iVar2 != 0) goto LAB_001aa0b8;
    sqlite3_bind_int64((sqlite3_stmt *)pSeg,1,((long)p->nIndex * (long)iLangid + lVar7) * 0x400);
    iValue = ((long)p->nIndex * (long)iLangid + lVar7) * 0x400 | 0x3ff;
    iVar3 = 2;
  }
  else {
    pSeg = (Fts3SegReader *)0x0;
    iVar2 = fts3SqlStmt(p,0xc,(sqlite3_stmt **)&pSeg,(sqlite3_value **)0x0);
    pFVar5 = pSeg;
    if (iVar2 != 0) goto LAB_001aa0b8;
    iValue = (ulong)(uint)iLevel + ((long)p->nIndex * (long)iLangid + lVar7) * 0x400;
    iVar3 = 1;
  }
  iVar2 = 0;
  sqlite3_bind_int64((sqlite3_stmt *)pFVar5,iVar3,iValue);
LAB_001aa0b8:
  piLeaf2 = &iLeavesEndBlock;
  if (isPrefix == 0) {
    piLeaf2 = (sqlite3_int64 *)0x0;
  }
  do {
    if ((iVar2 != 0) || (iVar2 = sqlite3_step((sqlite3_stmt *)pFVar5), iVar2 != 100))
    goto LAB_001aa1e3;
    pSeg = (Fts3SegReader *)0x0;
    iStartBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar5,1);
    iLeavesEndBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar5,2);
    iEndBlock = sqlite3_column_int64((sqlite3_stmt *)pFVar5,3);
    iVar3 = sqlite3_column_bytes((sqlite3_stmt *)pFVar5,4);
    zNode = (char *)sqlite3_column_blob((sqlite3_stmt *)pFVar5,4);
    if ((zTerm != (char *)0x0) && ((iStartBlock != 0 && (zNode != (char *)0x0)))) {
      iVar2 = fts3SelectLeaf(p,zTerm,nTerm,zNode,iVar3,&iStartBlock,piLeaf2);
      if (iVar2 != 0) goto LAB_001aa1e3;
      if (isScan == 0 && isPrefix == 0) {
        iLeavesEndBlock = iStartBlock;
      }
    }
    iVar2 = sqlite3Fts3SegReaderNew
                      (pCsr->nSegment + 1,(uint)(isScan == 0 && isPrefix == 0),iStartBlock,
                       iLeavesEndBlock,iEndBlock,zNode,iVar3,&pSeg);
    if (iVar2 != 0) goto LAB_001aa1e3;
    iVar2 = fts3SegReaderCursorAppend(pCsr,pSeg);
  } while( true );
}

Assistant:

static int fts3SegReaderCursor(
  Fts3Table *p,                   /* FTS3 table handle */
  int iLangid,                    /* Language id */
  int iIndex,                     /* Index to search (from 0 to p->nIndex-1) */
  int iLevel,                     /* Level of segments to scan */
  const char *zTerm,              /* Term to query for */
  int nTerm,                      /* Size of zTerm in bytes */
  int isPrefix,                   /* True for a prefix search */
  int isScan,                     /* True to scan from zTerm to EOF */
  Fts3MultiSegReader *pCsr        /* Cursor object to populate */
){
  int rc = SQLITE_OK;             /* Error code */
  sqlite3_stmt *pStmt = 0;        /* Statement to iterate through segments */
  int rc2;                        /* Result of sqlite3_reset() */

  /* If iLevel is less than 0 and this is not a scan, include a seg-reader
  ** for the pending-terms. If this is a scan, then this call must be being
  ** made by an fts4aux module, not an FTS table. In this case calling
  ** Fts3SegReaderPending might segfault, as the data structures used by
  ** fts4aux are not completely populated. So it's easiest to filter these
  ** calls out here.  */
  if( iLevel<0 && p->aIndex && p->iPrevLangid==iLangid ){
    Fts3SegReader *pSeg = 0;
    rc = sqlite3Fts3SegReaderPending(p, iIndex, zTerm, nTerm, isPrefix||isScan, &pSeg);
    if( rc==SQLITE_OK && pSeg ){
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

  if( iLevel!=FTS3_SEGCURSOR_PENDING ){
    if( rc==SQLITE_OK ){
      rc = sqlite3Fts3AllSegdirs(p, iLangid, iIndex, iLevel, &pStmt);
    }

    while( rc==SQLITE_OK && SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
      Fts3SegReader *pSeg = 0;

      /* Read the values returned by the SELECT into local variables. */
      sqlite3_int64 iStartBlock = sqlite3_column_int64(pStmt, 1);
      sqlite3_int64 iLeavesEndBlock = sqlite3_column_int64(pStmt, 2);
      sqlite3_int64 iEndBlock = sqlite3_column_int64(pStmt, 3);
      int nRoot = sqlite3_column_bytes(pStmt, 4);
      char const *zRoot = sqlite3_column_blob(pStmt, 4);

      /* If zTerm is not NULL, and this segment is not stored entirely on its
      ** root node, the range of leaves scanned can be reduced. Do this. */
      if( iStartBlock && zTerm && zRoot ){
        sqlite3_int64 *pi = (isPrefix ? &iLeavesEndBlock : 0);
        rc = fts3SelectLeaf(p, zTerm, nTerm, zRoot, nRoot, &iStartBlock, pi);
        if( rc!=SQLITE_OK ) goto finished;
        if( isPrefix==0 && isScan==0 ) iLeavesEndBlock = iStartBlock;
      }

      rc = sqlite3Fts3SegReaderNew(pCsr->nSegment+1,
          (isPrefix==0 && isScan==0),
          iStartBlock, iLeavesEndBlock,
          iEndBlock, zRoot, nRoot, &pSeg
      );
      if( rc!=SQLITE_OK ) goto finished;
      rc = fts3SegReaderCursorAppend(pCsr, pSeg);
    }
  }

 finished:
  rc2 = sqlite3_reset(pStmt);
  if( rc==SQLITE_DONE ) rc = rc2;

  return rc;
}